

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ia5.cc
# Opt level: O1

char * i2s_ASN1_IA5STRING(X509V3_EXT_METHOD *method,void *ext)

{
  char *__dest;
  
  if (((ext != (void *)0x0) && ((long)*ext != 0)) &&
     (__dest = (char *)OPENSSL_malloc((long)*ext + 1), __dest != (char *)0x0)) {
    if ((long)*ext == 0) {
      __dest[*ext] = '\0';
      return __dest;
    }
    memcpy(__dest,*(void **)((long)ext + 8),(long)*ext);
  }
  return (char *)0x0;
}

Assistant:

static char *i2s_ASN1_IA5STRING(const X509V3_EXT_METHOD *method, void *ext) {
  const ASN1_IA5STRING *ia5 = reinterpret_cast<const ASN1_IA5STRING *>(ext);
  char *tmp;
  if (!ia5 || !ia5->length) {
    return NULL;
  }
  if (!(tmp = reinterpret_cast<char *>(OPENSSL_malloc(ia5->length + 1)))) {
    return NULL;
  }
  OPENSSL_memcpy(tmp, ia5->data, ia5->length);
  tmp[ia5->length] = 0;
  return tmp;
}